

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Underwater_Acoustic_PDU.cpp
# Opt level: O2

void __thiscall
KDIS::PDU::Underwater_Acoustic_PDU::SetShafts
          (Underwater_Acoustic_PDU *this,
          vector<KDIS::DATA_TYPE::Shaft,_std::allocator<KDIS::DATA_TYPE::Shaft>_> *S)

{
  KUINT16 *pKVar1;
  long lVar2;
  
  pKVar1 = &(this->super_Header).super_Header6.m_ui16PDULength;
  *pKVar1 = *pKVar1 - ((ushort)((uint)(*(int *)&(this->m_vShafts).
                                                super__Vector_base<KDIS::DATA_TYPE::Shaft,_std::allocator<KDIS::DATA_TYPE::Shaft>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                      *(int *)&(this->m_vShafts).
                                               super__Vector_base<KDIS::DATA_TYPE::Shaft,_std::allocator<KDIS::DATA_TYPE::Shaft>_>
                                               ._M_impl.super__Vector_impl_data._M_start) >> 1) &
                      0xfff8);
  std::vector<KDIS::DATA_TYPE::Shaft,_std::allocator<KDIS::DATA_TYPE::Shaft>_>::operator=
            (&this->m_vShafts,S);
  lVar2 = (long)(this->m_vShafts).
                super__Vector_base<KDIS::DATA_TYPE::Shaft,_std::allocator<KDIS::DATA_TYPE::Shaft>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(this->m_vShafts).
                super__Vector_base<KDIS::DATA_TYPE::Shaft,_std::allocator<KDIS::DATA_TYPE::Shaft>_>.
                _M_impl.super__Vector_impl_data._M_start >> 4;
  pKVar1 = &(this->super_Header).super_Header6.m_ui16PDULength;
  *pKVar1 = *pKVar1 + (short)lVar2 * 8;
  this->m_ui8NumShafts = (KUINT8)lVar2;
  return;
}

Assistant:

void Underwater_Acoustic_PDU::SetShafts( const vector<Shaft> & S )
{
    // Reset PDU length
    m_ui16PDULength -= m_vShafts.size() * Shaft::SHAFT_SIZE;

    m_vShafts = S;

    // Calculate the new PDU length
    m_ui16PDULength += m_vShafts.size() * Shaft::SHAFT_SIZE;

    m_ui8NumShafts = m_vShafts.size();
}